

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

void al_get_clipping_rectangle(int *x,int *y,int *w,int *h)

{
  ALLEGRO_BITMAP *pAVar1;
  
  pAVar1 = al_get_target_bitmap();
  if (x != (int *)0x0) {
    *x = pAVar1->cl;
  }
  if (y != (int *)0x0) {
    *y = pAVar1->ct;
  }
  if (w != (int *)0x0) {
    *w = pAVar1->cr_excl - pAVar1->cl;
  }
  if (h != (int *)0x0) {
    *h = pAVar1->cb_excl - pAVar1->ct;
  }
  return;
}

Assistant:

void al_get_clipping_rectangle(int *x, int *y, int *w, int *h)
{
   ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();

   ASSERT(bitmap);

   if (x) *x = bitmap->cl;
   if (y) *y = bitmap->ct;
   if (w) *w = bitmap->cr_excl - bitmap->cl;
   if (h) *h = bitmap->cb_excl - bitmap->ct;
}